

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperFloatingPointEQ<long_double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,longdouble val1,
          longdouble val2)

{
  bool bVar1;
  floating_point<long_double> *in_RCX;
  string local_f8;
  string local_d8;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  floating_point<long_double> f2;
  floating_point<long_double> f1;
  longdouble val2_local;
  longdouble val1_local;
  char *expr2_local;
  char *expr1_local;
  
  floating_point<long_double>::floating_point
            ((floating_point<long_double> *)((long)&f2.m_v + 8),val1);
  floating_point<long_double>::floating_point((floating_point<long_double> *)local_68,val2);
  bVar1 = floating_point<long_double>::AlmostEquals
                    ((floating_point<long_double> *)((long)&f2.m_v + 8),(_Myt *)local_68);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<iutest::floating_point<long_double>,iutest::floating_point<long_double>>
              (&local_a8,(internal *)((long)&f2.m_v + 8),(floating_point<long_double> *)local_68,
               in_RCX);
    detail::ShowStringQuoted(&local_88,&local_a8);
    FormatForComparisonFailureMessage<iutest::floating_point<long_double>,iutest::floating_point<long_double>>
              (&local_f8,(internal *)local_68,(floating_point<long_double> *)((long)&f2.m_v + 8),
               in_RCX);
    detail::ShowStringQuoted(&local_d8,&local_f8);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_88,&local_d8,false);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointEQ(const char* expr1, const char* expr2
                                                , RawType val1, RawType val2)
{
    floating_point<RawType> f1(val1), f2(val2);
    if IUTEST_COND_LIKELY( f1.AlmostEquals(f2) )
    {
        return AssertionSuccess();
    }